

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::reportFinished(QFutureInterfaceBase *this)

{
  long lVar1;
  bool bVar2;
  QFutureInterfaceBasePrivate *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  int in_stack_ffffffffffffff78;
  CallOutType in_stack_ffffffffffffff7c;
  QFutureCallOutEvent *in_stack_ffffffffffffff80;
  QAtomicInt *in_stack_ffffffffffffff88;
  QFutureCallOutEvent *callOutEvent;
  QFutureInterfaceBasePrivate *pQVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar2 = isFinished((QFutureInterfaceBase *)0x6ddccf);
  if (!bVar2) {
    switch_from_to(in_stack_ffffffffffffff88,(int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
    QWaitCondition::wakeAll((QWaitCondition *)in_stack_ffffffffffffff80);
    callOutEvent = (QFutureCallOutEvent *)(in_RDI->continuationMutex).d_ptr._q_value._M_b._M_p;
    QFutureCallOutEvent::QFutureCallOutEvent
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    QFutureInterfaceBasePrivate::sendCallOut(in_RDI,callOutEvent);
    QFutureCallOutEvent::~QFutureCallOutEvent(in_stack_ffffffffffffff80);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::reportFinished()
{
    QMutexLocker locker(&d->m_mutex);
    if (!isFinished()) {
        switch_from_to(d->state, Running, Finished);
        d->waitCondition.wakeAll();
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Finished));
    }
}